

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::WriteToStringAndLog(LogMessage *this)

{
  int len;
  char *start;
  LogMessage *this_local;
  
  if ((this->data_->field_6).sink_ != (LogSink *)0x0) {
    if ((this->data_->num_chars_to_log_ == 0) ||
       (this->data_->message_text_[this->data_->num_chars_to_log_ - 1] != '\n')) {
      RawLog__(3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x644,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
               ,"");
    }
    std::__cxx11::string::assign
              ((char *)(this->data_->field_6).sink_,
               (ulong)(this->data_->message_text_ + this->data_->num_prefix_chars_));
  }
  SendToLog(this);
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->message_ != NULL) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
               data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");
    // Omit prefix of message and trailing newline when writing to message_.
    const char *start = data_->message_text_ + data_->num_prefix_chars_;
    int len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->message_->assign(start, len);
  }
  SendToLog();
}